

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_execute.cpp
# Opt level: O1

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,ExecuteStatement *stmt)

{
  optional_ptr<duckdb::LogicalType,_true> result_type;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psVar1;
  StatementProperties *__ht;
  LogicalType *this_00;
  ExpressionType EVar2;
  ClientContext *pCVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pcVar4;
  idx_t iVar5;
  element_type *peVar6;
  bool bVar7;
  StatementReturnType SVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  undefined8 uVar10;
  __node_base _Var11;
  undefined1 auVar12 [8];
  bool bVar13;
  int iVar14;
  ClientData *pCVar15;
  iterator iVar16;
  PreparedStatementData *pPVar17;
  pointer pSVar18;
  Binder *pBVar19;
  pointer pPVar20;
  type binder;
  pointer this_02;
  BoundConstantExpression *pBVar21;
  type expr;
  mapped_type *this_03;
  pointer this_04;
  ClientContextState *pCVar22;
  Binder *pBVar23;
  StatementProperties *this_05;
  tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> this_06;
  pointer pLVar24;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var25;
  BinderException *this_07;
  LogicalType *type;
  element_type *peVar26;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var27;
  shared_ptr<duckdb::ClientContextState,_true> *state;
  undefined1 auVar28 [8];
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  BoundStatement *result;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> bound_expr;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  rebound_plan;
  BindPreparedStatementCallbackInfo info;
  Value value;
  shared_ptr<duckdb::Binder,_true> constant_binder;
  case_insensitive_map_t<BoundParameterData> bind_values;
  ConstantBinder cbinder;
  LogicalType value_type;
  shared_ptr<duckdb::PreparedStatementData,_true> local_488;
  BoundStatement *local_478;
  Binder *local_470;
  long *local_468;
  undefined1 local_460 [8];
  LogicalType local_458;
  Value local_440;
  LogicalType local_400;
  undefined1 local_3e8 [65];
  PhysicalType PStack_3a7;
  __node_base local_3a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_398;
  Value local_378;
  undefined1 local_338 [56];
  _Hash_node_base local_300 [2];
  undefined1 local_2f0 [32];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_270;
  undefined1 local_268 [16];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_258;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_240;
  undefined1 local_208 [24];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1f0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1b8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_168;
  LogicalType local_130;
  LogicalType local_118;
  LogicalType local_100;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e8;
  Value local_b0;
  Value local_70;
  
  local_338._24_8_ = (stmt->super_SQLStatement).named_param_map._M_h._M_element_count;
  local_478 = __return_storage_ptr__;
  pCVar15 = ClientData::Get(this->context);
  iVar16 = ::std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(pCVar15->prepared_statements)._M_h,&stmt->name);
  if (iVar16.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    this_07 = (BinderException *)__cxa_allocate_exception(0x10);
    local_278 = (undefined1  [8])local_268;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,"Prepared statement \"%s\" does not exist","");
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    pcVar4 = (stmt->name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,pcVar4,pcVar4 + (stmt->name)._M_string_length);
    BinderException::BinderException<std::__cxx11::string>(this_07,(string *)local_278,&local_298);
    __cxa_throw(this_07,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_488.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = *(element_type **)
            ((long)iVar16.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>,_true>
                   ._M_cur + 0x28);
  local_488.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        ((long)iVar16.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>,_true>
               ._M_cur + 0x30);
  if (local_488.internal.
      super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_488.internal.
       super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (int)*(size_type *)
                 &(local_488.internal.
                   super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_488.internal.
       super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (int)*(size_type *)
                 &(local_488.internal.
                   super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pPVar17 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&local_488);
  pSVar18 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
            operator->(&pPVar17->unbound_statement);
  PreparedStatement::
  VerifyParameters<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (&stmt->named_values,&pSVar18->named_param_map);
  local_2d0._M_buckets = &local_2d0._M_single_bucket;
  local_2d0._M_bucket_count = (size_type)&DAT_00000001;
  local_2d0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2d0._M_element_count = 0;
  local_2d0._M_rehash_policy._M_max_load_factor = 1.0;
  local_2d0._M_rehash_policy._M_next_resize = 0;
  local_2d0._M_single_bucket = (_Hash_node_base *)0x0;
  CreateBinder((Binder *)local_338,this->context,(optional_ptr<duckdb::Binder,_true>)0x0,
               REGULAR_BINDER);
  local_470 = this;
  pBVar19 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_338);
  SetCanContainNulls(pBVar19,true);
  peVar26 = (element_type *)(stmt->named_values)._M_h._M_before_begin._M_nxt;
  local_338._16_8_ = iVar16;
  if (peVar26 != (element_type *)0x0) {
    local_338._32_8_ = &PTR__ConstantBinder_019b3340;
    do {
      result_type.ptr = (LogicalType *)(&(peVar26->alias).field_2._M_allocated_capacity + 1);
      local_458._0_8_ = peVar26;
      pPVar20 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)result_type.ptr);
      EVar2 = (pPVar20->super_BaseExpression).type;
      binder = shared_ptr<duckdb::Binder,_true>::operator*
                         ((shared_ptr<duckdb::Binder,_true> *)local_338);
      pCVar3 = local_470->context;
      local_338._40_8_ = local_300;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_338 + 0x28),"EXECUTE statement","");
      ConstantBinder::ConstantBinder
                ((ConstantBinder *)local_278,binder,pCVar3,(string *)(local_338 + 0x28));
      if ((_Hash_node_base *)local_338._40_8_ != local_300) {
        operator_delete((void *)local_338._40_8_);
      }
      ExpressionBinder::Bind
                ((ExpressionBinder *)local_460,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_278,result_type,false);
      BoundParameterData::BoundParameterData((BoundParameterData *)local_3e8);
      if (EVar2 == VALUE_CONSTANT) {
        this_02 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)local_460);
        pBVar21 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                            (&this_02->super_BaseExpression);
        LogicalType::LogicalType(&local_378.type_);
        LogicalType::LogicalType(&local_440.type_,VARCHAR);
        this_00 = &(pBVar21->super_Expression).return_type;
        bVar13 = LogicalType::operator==(this_00,&local_440.type_);
        if (bVar13) {
          StringType::GetCollation_abi_cxx11_((string *)local_2f0,(StringType *)this_00,type);
          bVar13 = (__buckets_ptr)local_2f0._8_8_ == (__buckets_ptr)0x0;
          if ((__node_base_ptr)local_2f0._0_8_ != (__node_base_ptr)(local_2f0 + 0x10)) {
            operator_delete((void *)local_2f0._0_8_);
          }
        }
        else {
          bVar13 = false;
        }
        LogicalType::~LogicalType(&local_440.type_);
        if (bVar13) {
          LogicalType::LogicalType(&local_440.type_,STRING_LITERAL);
          peVar26 = (element_type *)local_458._0_8_;
LAB_006f6560:
          uVar10 = local_440.type_._0_8_;
          local_378.type_.id_ = local_440.type_.id_;
          local_378.type_.physical_type_ = local_440.type_.physical_type_;
          local_440.type_._0_8_ = uVar10;
          LogicalType::~LogicalType(&local_440.type_);
        }
        else {
          bVar13 = LogicalType::IsIntegral(this_00);
          peVar26 = (element_type *)local_458._0_8_;
          if (bVar13) {
            LogicalType::INTEGER_LITERAL(&local_440.type_,&pBVar21->value);
            goto LAB_006f6560;
          }
          if (&local_378 != &pBVar21->value) {
            local_378.type_.id_ = (pBVar21->value).type_.id_;
            local_378.type_.physical_type_ = (pBVar21->value).type_.physical_type_;
            shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                      (&local_378.type_.type_info_,&(pBVar21->value).type_.type_info_);
          }
        }
        Value::Value(&local_70,&pBVar21->value);
        LogicalType::LogicalType(&local_100,&local_378.type_);
        Value::Value(&local_440,&local_70);
        LogicalType::LogicalType(&local_400,&local_100);
        Value::operator=((Value *)local_3e8,&local_440);
        _Var9._M_pi = _Stack_398._M_pi;
        _Var11._M_nxt = local_3a0._M_nxt;
        _Stack_398._M_pi =
             local_400.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        local_3a0._M_nxt =
             (_Hash_node_base *)
             local_400.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_3e8[0x40] = local_400.id_;
        PStack_3a7 = local_400.physical_type_;
        local_400.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Var9._M_pi;
        local_400.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)_Var11._M_nxt;
        LogicalType::~LogicalType(&local_400);
        Value::~Value(&local_440);
        LogicalType::~LogicalType(&local_100);
        Value::~Value(&local_70);
        LogicalType::~LogicalType(&local_378.type_);
      }
      else {
        pCVar3 = local_470->context;
        expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)local_460);
        peVar26 = (element_type *)local_458._0_8_;
        ExpressionExecutor::EvaluateScalar(&local_378,pCVar3,expr,true);
        LogicalType::LogicalType(&local_118,&local_378.type_);
        Value::Value(&local_b0,&local_378);
        LogicalType::LogicalType(&local_130,&local_118);
        Value::Value(&local_440,&local_b0);
        LogicalType::LogicalType(&local_400,&local_130);
        Value::operator=((Value *)local_3e8,&local_440);
        _Var9._M_pi = _Stack_398._M_pi;
        _Var11._M_nxt = local_3a0._M_nxt;
        _Stack_398._M_pi =
             local_400.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        local_3a0._M_nxt =
             (_Hash_node_base *)
             local_400.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_3e8[0x40] = local_400.id_;
        PStack_3a7 = local_400.physical_type_;
        local_400.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Var9._M_pi;
        local_400.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)_Var11._M_nxt;
        LogicalType::~LogicalType(&local_400);
        Value::~Value(&local_440);
        LogicalType::~LogicalType(&local_130);
        Value::~Value(&local_b0);
        LogicalType::~LogicalType(&local_118);
        Value::~Value(&local_378);
      }
      this_03 = ::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_2d0,(key_type *)&peVar26->type);
      Value::operator=(&this_03->value,(Value *)local_3e8);
      _Var9._M_pi = _Stack_398._M_pi;
      _Var11._M_nxt = local_3a0._M_nxt;
      (this_03->return_type).id_ = local_3e8[0x40];
      (this_03->return_type).physical_type_ = PStack_3a7;
      psVar1 = &(this_03->return_type).type_info_;
      uVar29 = *(undefined4 *)
                &(psVar1->internal).
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar30 = *(undefined4 *)
                ((long)&(this_03->return_type).type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      peVar6 = (psVar1->internal).
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar31 = *(undefined4 *)
                &(this_03->return_type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar32 = *(undefined4 *)
                ((long)&(this_03->return_type).type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (this_03->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this_03->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_3a0._M_nxt = (_Hash_node_base *)0x0;
      _Stack_398._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_01 = (this_03->return_type).type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (this_03->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var11._M_nxt;
      (this_03->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var9._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_458._0_8_ = peVar6;
        local_458.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = uVar31;
        local_458.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = uVar32;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        uVar29 = local_458._0_4_;
        uVar30 = local_458._4_4_;
        uVar31 = local_458.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_;
        uVar32 = local_458.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_;
      }
      _Var9._M_pi = _Stack_398._M_pi;
      local_3a0._M_nxt._4_4_ = uVar30;
      local_3a0._M_nxt._0_1_ = (LogicalTypeId)uVar29;
      local_3a0._M_nxt._1_1_ = SUB41(uVar29,1);
      local_3a0._M_nxt._2_2_ = SUB42(uVar29,2);
      _Stack_398._M_pi._4_4_ = uVar32;
      _Stack_398._M_pi._0_4_ = uVar31;
      if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_3e8 + 0x40));
      Value::~Value((Value *)local_3e8);
      if (local_460 != (undefined1  [8])0x0) {
        (*((BaseExpression *)local_460)->_vptr_BaseExpression[1])();
      }
      local_278 = (undefined1  [8])local_338._32_8_;
      if (local_240._M_single_bucket != (__node_base_ptr)(local_208 + 8)) {
        operator_delete(local_240._M_single_bucket);
      }
      ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_278);
      peVar26 = (element_type *)peVar26->_vptr_ExtraTypeInfo;
    } while (peVar26 != (element_type *)0x0);
  }
  local_440.type_._0_8_ = (Binder *)0x0;
  pPVar17 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&local_488);
  pBVar19 = local_470;
  bVar13 = PreparedStatementData::RequireRebind
                     (pPVar17,local_470->context,
                      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                       *)&local_2d0);
  this_04 = unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
            ::operator->(&pBVar19->context->registered_state);
  RegisteredStateManager::States
            ((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true> *)local_278,this_04
            );
  if (local_278 != (undefined1  [8])_Stack_270._M_pi) {
    auVar28 = local_278;
    do {
      local_3e8._0_8_ = shared_ptr<duckdb::PreparedStatementData,_true>::operator*(&local_488);
      local_3e8._8_8_ =
           (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
            *)&local_2d0;
      pCVar22 = shared_ptr<duckdb::ClientContextState,_true>::operator->
                          ((shared_ptr<duckdb::ClientContextState,_true> *)auVar28);
      iVar14 = (**(code **)(*(long *)pCVar22 + 0x70))(pCVar22,local_470->context,local_3e8,bVar13);
      if (iVar14 == 1) {
        bVar13 = true;
      }
      auVar28 = (undefined1  [8])&((Binder *)auVar28)->context;
    } while (auVar28 != (undefined1  [8])_Stack_270._M_pi);
    bVar13 = bVar13 == true;
    pBVar19 = local_470;
  }
  ::std::
  vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
  ::~vector((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
             *)local_278);
  if (bVar13 != false) {
    Planner::Planner((Planner *)local_278,pBVar19->context);
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_240,&local_2d0);
    pPVar17 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                        ((shared_ptr<duckdb::PreparedStatementData,_true> *)
                         (local_338._16_8_ + 0x28));
    pSVar18 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
              operator->(&pPVar17->unbound_statement);
    (*pSVar18->_vptr_SQLStatement[3])(&local_468,pSVar18);
    Planner::PrepareSQLStatement
              ((Planner *)local_3e8,
               (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
               local_278);
    uVar10 = local_3e8._8_8_;
    local_488.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_3e8._0_8_;
    _Var9._M_pi = local_488.internal.
                  super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_3e8._0_8_ =
         (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)0x0;
    local_3e8._8_8_ = (element_type *)0x0;
    local_488.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if ((element_type *)local_3e8._8_8_ != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e8._8_8_);
    }
    if (local_468 != (long *)0x0) {
      (**(code **)(*local_468 + 8))();
    }
    auVar28 = local_278;
    uVar10 = local_440.type_._0_8_;
    local_468 = (long *)0x0;
    local_278 = (undefined1  [8])0x0;
    auVar12 = local_278;
    local_278[0] = auVar28[0];
    local_278[1] = auVar28[1];
    local_278._2_6_ = auVar28._2_6_;
    local_440.type_.id_ = local_278[0];
    local_440.type_.physical_type_ = local_278[1];
    local_440.type_._2_6_ = local_278._2_6_;
    local_278 = auVar12;
    if ((Binder *)uVar10 != (Binder *)0x0) {
      (**(code **)(((__shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2> *)
                   &((Binding *)uVar10)->_vptr_Binding)->_M_ptr + 8))();
    }
    pBVar23 = shared_ptr<duckdb::Binder,_true>::operator->
                        ((shared_ptr<duckdb::Binder,_true> *)local_208);
    pBVar19->bound_tables = pBVar23->bound_tables;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_168);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_1b8);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_1f0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_240);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               (local_268 + 0x10));
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&_Stack_270);
    if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_278 !=
        (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
      (**(code **)(((__shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2> *)
                   &((BaseExpression *)local_278)->_vptr_BaseExpression)->_M_ptr + 8))();
    }
  }
  this_05 = GetStatementProperties(pBVar19);
  pPVar17 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&local_488);
  __ht = &pPVar17->properties;
  if ((__ht != this_05) &&
     (::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this_05,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)__ht), __ht != this_05)) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this_05->modified_databases,&(pPVar17->properties).modified_databases._M_h);
  }
  bVar13 = (pPVar17->properties).allow_stream_result;
  bVar7 = (pPVar17->properties).bound_all_parameters;
  SVar8 = (pPVar17->properties).return_type;
  uVar29 = *(undefined4 *)&(pPVar17->properties).field_0x74;
  iVar5 = (pPVar17->properties).parameter_count;
  this_05->requires_valid_transaction = (pPVar17->properties).requires_valid_transaction;
  this_05->allow_stream_result = bVar13;
  this_05->bound_all_parameters = bVar7;
  this_05->return_type = SVar8;
  *(undefined4 *)&this_05->field_0x74 = uVar29;
  this_05->parameter_count = iVar5;
  this_05->always_require_rebind = (pPVar17->properties).always_require_rebind;
  this_05->parameter_count = local_338._24_8_;
  (local_478->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_478->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_478->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_478->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_478->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (local_478->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_478->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar17 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&local_488);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_478->names,
              &(pPVar17->names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  pPVar17 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&local_488);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(local_478->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &(pPVar17->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  pPVar17 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&local_488);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_e8,&local_2d0);
  PreparedStatementData::Bind(pPVar17,(case_insensitive_map_t<BoundParameterData> *)&local_e8);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_e8);
  if ((Binder *)local_440.type_._0_8_ == (Binder *)0x0) {
    _Var25.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)operator_new(0x78);
    local_278 = (undefined1  [8])
                local_488.internal.
                super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    _Stack_270._M_pi =
         local_488.internal.
         super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    local_488.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_488.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LogicalExecute::LogicalExecute
              ((LogicalExecute *)
               _Var25.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
               (shared_ptr<duckdb::PreparedStatementData,_true> *)local_278);
    if ((pointer)_Stack_270._M_pi != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_270._M_pi);
    }
    _Var27._M_head_impl =
         (local_478->plan).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (local_478->plan).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         _Var25.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  }
  else {
    this_06.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )operator_new(0x78);
    local_278 = (undefined1  [8])
                local_488.internal.
                super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    _Stack_270._M_pi =
         local_488.internal.
         super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    local_488.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_488.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LogicalExecute::LogicalExecute
              ((LogicalExecute *)
               this_06.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
               (shared_ptr<duckdb::PreparedStatementData,_true> *)local_278);
    local_3e8._0_8_ =
         this_06.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    if ((pointer)_Stack_270._M_pi != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_270._M_pi);
    }
    pLVar24 = unique_ptr<duckdb::LogicalExecute,_std::default_delete<duckdb::LogicalExecute>,_true>
              ::operator->((unique_ptr<duckdb::LogicalExecute,_std::default_delete<duckdb::LogicalExecute>,_true>
                            *)local_3e8);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
              ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                *)&(pLVar24->super_LogicalOperator).children,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_440);
    uVar10 = local_3e8._0_8_;
    local_3e8._0_8_ = (Binder *)0x0;
    _Var25.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (local_478->plan).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (local_478->plan).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)uVar10;
    _Var27._M_head_impl = (LogicalOperator *)local_3e8._0_8_;
    if (_Var25.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (LogicalOperator *)0x0) {
      (**(code **)(*(long *)_Var25.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                            _M_head_impl + 8))();
      _Var27._M_head_impl = (LogicalOperator *)local_3e8._0_8_;
    }
  }
  if ((type)_Var27._M_head_impl != (type)0x0) {
    (**(code **)((long)(_Var27._M_head_impl)->_vptr_LogicalOperator + 8))();
  }
  if ((Binder *)local_440.type_._0_8_ != (Binder *)0x0) {
    (**(code **)(((__shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2> *)
                 &((Binding *)local_440.type_._0_8_)->_vptr_Binding)->_M_ptr + 8))();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_2d0);
  if (local_488.internal.
      super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_488.internal.
               super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return local_478;
}

Assistant:

BoundStatement Binder::Bind(ExecuteStatement &stmt) {
	auto parameter_count = stmt.named_param_map.size();

	// bind the prepared statement
	auto &client_data = ClientData::Get(context);

	auto entry = client_data.prepared_statements.find(stmt.name);
	if (entry == client_data.prepared_statements.end()) {
		throw BinderException("Prepared statement \"%s\" does not exist", stmt.name);
	}

	// check if we need to rebind the prepared statement
	// this happens if the catalog changes, since in this case e.g. tables we relied on may have been deleted
	auto prepared = entry->second;
	auto &named_param_map = prepared->unbound_statement->named_param_map;

	PreparedStatement::VerifyParameters(stmt.named_values, named_param_map);

	auto &mapped_named_values = stmt.named_values;
	// bind any supplied parameters
	case_insensitive_map_t<BoundParameterData> bind_values;
	auto constant_binder = Binder::CreateBinder(context);
	constant_binder->SetCanContainNulls(true);
	for (auto &pair : mapped_named_values) {
		bool is_literal = pair.second->GetExpressionType() == ExpressionType::VALUE_CONSTANT;

		ConstantBinder cbinder(*constant_binder, context, "EXECUTE statement");
		auto bound_expr = cbinder.Bind(pair.second);
		BoundParameterData parameter_data;
		if (is_literal) {
			auto &constant = bound_expr->Cast<BoundConstantExpression>();
			LogicalType return_type;
			if (constant.return_type == LogicalTypeId::VARCHAR &&
			    StringType::GetCollation(constant.return_type).empty()) {
				return_type = LogicalTypeId::STRING_LITERAL;
			} else if (constant.return_type.IsIntegral()) {
				return_type = LogicalType::INTEGER_LITERAL(constant.value);
			} else {
				return_type = constant.value.type();
			}
			parameter_data = BoundParameterData(std::move(constant.value), std::move(return_type));
		} else {
			auto value = ExpressionExecutor::EvaluateScalar(context, *bound_expr, true);
			auto value_type = value.type();
			parameter_data = BoundParameterData(std::move(value), std::move(value_type));
		}
		bind_values[pair.first] = std::move(parameter_data);
	}
	unique_ptr<LogicalOperator> rebound_plan;

	RebindQueryInfo rebind = RebindQueryInfo::DO_NOT_REBIND;
	if (prepared->RequireRebind(context, bind_values)) {
		rebind = RebindQueryInfo::ATTEMPT_TO_REBIND;
	}
	for (auto &state : context.registered_state->States()) {
		BindPreparedStatementCallbackInfo info {*prepared, bind_values};
		auto new_rebind = state->OnRebindPreparedStatement(context, info, rebind);
		if (new_rebind == RebindQueryInfo::ATTEMPT_TO_REBIND) {
			rebind = RebindQueryInfo::ATTEMPT_TO_REBIND;
		}
	}
	if (rebind == RebindQueryInfo::ATTEMPT_TO_REBIND) {
		// catalog was modified or statement does not have clear types: rebind the statement before running the execute
		Planner prepared_planner(context);
		prepared_planner.parameter_data = bind_values;
		prepared = prepared_planner.PrepareSQLStatement(entry->second->unbound_statement->Copy());
		rebound_plan = std::move(prepared_planner.plan);
		D_ASSERT(prepared->properties.bound_all_parameters);
		this->bound_tables = prepared_planner.binder->bound_tables;
	}
	// copy the properties of the prepared statement into the planner
	auto &properties = GetStatementProperties();
	properties = prepared->properties;
	properties.parameter_count = parameter_count;

	BoundStatement result;
	result.names = prepared->names;
	result.types = prepared->types;

	prepared->Bind(std::move(bind_values));
	if (rebound_plan) {
		auto execute_plan = make_uniq<LogicalExecute>(std::move(prepared));
		execute_plan->children.push_back(std::move(rebound_plan));
		result.plan = std::move(execute_plan);
	} else {
		result.plan = make_uniq<LogicalExecute>(std::move(prepared));
	}
	return result;
}